

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parser_increment(parser *parser)

{
  parser *parser_local;
  
  if (parser->pos <= parser->buffer_size) {
    if (parser->buffer[parser->pos] == '\n') {
      parser->line_num = parser->line_num + 1;
      parser->col_num = 1;
    }
    else {
      parser->col_num = parser->col_num + 1;
    }
    parser->pos = parser->pos + 1;
  }
  return;
}

Assistant:

void parser_increment(struct parser *parser)
{
        if (parser->pos > parser->buffer_size) {
                return;
        }

        if (parser->buffer[parser->pos] == '\n') {
                ++parser->line_num;
                parser->col_num = 1;
        } else {
                ++parser->col_num;
        }

        ++parser->pos;
}